

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomFourAction.cpp
# Opt level: O1

ActionResults * __thiscall GreenRoomFourAction::Use(GreenRoomFourAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *pIVar3;
  ActionResults *pAVar4;
  string information;
  itemType local_64;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  string local_40;
  
  iVar1 = Command::getActedOnItem((this->super_AbstractRoomAction).commands);
  if (iVar1 != KID) {
    pAVar4 = AbstractRoomAction::Use(&this->super_AbstractRoomAction);
    return pAVar4;
  }
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 != BUCKET) {
    local_60 = (undefined1 *)CONCAT44(local_60._4_4_,0x13);
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,(itemType *)&local_60);
    iVar2 = ItemWrapper::getLocation(pIVar3);
    if (iVar2 != ACTIVE) {
      pAVar4 = AbstractRoomAction::Use(&this->super_AbstractRoomAction);
      return pAVar4;
    }
  }
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "The otherworldy child drinks from the clean water basin.You can see strength return until a large burst of light illuminates the room.The room completely changes into vibrant gold colours. You have completed this leg of the journey.The creature now focuses on you, and with a flicker of his eye you hear the words in your ears....GO!\nThe creature vanishes and you see all doors lead back to the main entrance."
             ,"");
  local_64 = KID;
  pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_64);
  ItemWrapper::setLocation(pIVar3,HIDDEN);
  local_64 = GREEN_KEY;
  pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_64);
  ItemWrapper::setLocation(pIVar3,HIDDEN);
  pAVar4 = (ActionResults *)operator_new(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,local_60,local_60 + local_58);
  ActionResults::ActionResults(pAVar4,CURRENT,&local_40,FIREWORKS);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return pAVar4;
}

Assistant:

ActionResults *GreenRoomFourAction::Use() {

    if(commands->getActedOnItem() != KID)
        return AbstractRoomAction::Use();
    else {
        if (commands->getMainItem() != BUCKET && itemList->getValue(CLEAN_BUCKET)->getLocation() != ACTIVE) {
            return AbstractRoomAction::Use();
        } else {

            std::string information = "The otherworldy child drinks from the clean water basin."
                    "You can see strength return until a large burst of light illuminates the room."
                    "The room completely changes into vibrant gold colours. You have completed this leg of the journey."
                    "The creature now focuses on you, and with a flicker of his eye you hear the words in your ears....GO!\n"
                    "The creature vanishes and you see all doors lead back to the main entrance.";
            itemList->getValue(KID)->setLocation(HIDDEN);
            itemList->getValue(GREEN_KEY)->setLocation(HIDDEN);
            return new ActionResults(CURRENT, information, FIREWORKS);
        }
    }
}